

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::testRunEnded
          (CumulativeReporterBase<Catch::SonarQubeReporter> *this,TestRunStats *testRunStats)

{
  pointer psVar1;
  pointer psVar2;
  pointer psVar3;
  pointer psVar4;
  shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
  node;
  undefined1 local_21;
  value_type local_20;
  
  local_20.
  super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>>>,std::allocator<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>>>>,Catch::TestRunStats_const&>
            (&local_20.
              super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,
             (Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>
              **)&local_20,
             (allocator<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>
              *)&local_21,testRunStats);
  psVar1 = ((local_20.
             super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  psVar2 = (this->m_testGroups).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = ((local_20.
             super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar4 = ((local_20.
             super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr)->children).
           super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ((local_20.
    super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->children).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (this->m_testGroups).
       super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  ((local_20.
    super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->children).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar2;
  ((local_20.
    super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
   ._M_ptr)->children).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->m_testGroups).
       super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_testGroups).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = psVar3;
  (this->m_testGroups).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = psVar4;
  (this->m_testGroups).
  super__Vector_base<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = psVar1;
  clara::std::
  vector<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>,_std::allocator<std::shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>_>_>_>
  ::push_back(&this->m_testRuns,&local_20);
  (*(this->super_IStreamingReporter)._vptr_IStreamingReporter[0x12])(this);
  if (local_20.
      super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_20.
               super___shared_ptr<Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestRunStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestGroupStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::Node<Catch::TestCaseStats,_Catch::CumulativeReporterBase<Catch::SonarQubeReporter>::SectionNode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void testRunEnded(TestRunStats const& testRunStats) override {
            auto node = std::make_shared<TestRunNode>(testRunStats);
            node->children.swap(m_testGroups);
            m_testRuns.push_back(node);
            testRunEndedCumulative();
        }